

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Unicode.cpp
# Opt level: O1

utf32_t axl::enc::toLowerCase(utf32_t c)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((uint)c < 0xd800) {
    uVar2 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar2 = ((uint)c >> 5) + 0x140;
    if (0xdbff < c) {
      uVar2 = (uint)c >> 5;
    }
  }
  else {
    uVar3 = 0xcd8;
    if ((0x10ffff < (uint)c) || (uVar3 = 0x2b20, 0xe07ff < c)) goto LAB_0011c2e7;
    uVar2 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar3 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar2] * 4);
LAB_0011c2e7:
  uVar1 = ucase_props_trieIndex[uVar3];
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 2) != 0) {
      return c + ((int)(short)uVar1 >> 7);
    }
  }
  else {
    uVar3 = (ulong)(uVar1 >> 5);
    if ((ucase_props_exceptions[uVar3] & 1) != 0) {
      if ((ucase_props_exceptions[uVar3] >> 8 & 1) == 0) {
        return (utf32_t)ucase_props_exceptions[uVar3 + 1];
      }
      c = CONCAT22(ucase_props_exceptions[uVar3 + 1],ucase_props_exceptions[uVar3 + 2]);
    }
  }
  return c;
}

Assistant:

utf32_t
toLowerCase(utf32_t c) {
	const UCaseProps *csp = GET_CASE_PROPS();
	uint16_t props=UTRIE2_GET16(&csp->trie, c);
	if(!PROPS_HAS_EXCEPTION(props)) {
		if(UCASE_GET_TYPE(props)>=UCASE_UPPER) {
			c+=UCASE_GET_DELTA(props);
		}
	} else {
		const uint16_t *pe=GET_EXCEPTIONS(csp, props);
		uint16_t excWord=*pe++;
		if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
			GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe, c);
		}
	}
	return c;
}